

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f46971::TypeInfos::TypeInfos(TypeInfos *this)

{
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  TypeInfos *local_10;
  TypeInfos *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"boolean",&local_31);
  dap::BasicTypeInfo<dap::boolean>::BasicTypeInfo(&this->boolean,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"string",&local_69);
  dap::
  BasicTypeInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  BasicTypeInfo(&this->string,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"integer",&local_91);
  dap::BasicTypeInfo<dap::integer>::BasicTypeInfo(&this->integer,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"number",&local_b9);
  dap::BasicTypeInfo<dap::number>::BasicTypeInfo(&this->number,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"object",&local_e1);
  dap::
  BasicTypeInfo<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
  ::BasicTypeInfo(&this->object,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"any",&local_109);
  dap::BasicTypeInfo<dap::any>::BasicTypeInfo(&this->any,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  NullTI::NullTI(&this->null);
  std::
  vector<std::unique_ptr<dap::TypeInfo,_std::default_delete<dap::TypeInfo>_>,_std::allocator<std::unique_ptr<dap::TypeInfo,_std::default_delete<dap::TypeInfo>_>_>_>
  ::vector(&this->types);
  std::atomic<unsigned_long>::atomic(&this->refcount,1);
  return;
}

Assistant:

TypeInfos() = default;